

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator%(unsigned_long lhs,
         SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  bool bVar1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  this;
  char in_SIL;
  unsigned_long in_RDI;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> result;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd8;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  unsigned_long local_10;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_1;
  
  local_10 = in_RDI;
  local_2.m_int = in_SIL;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_1);
  bVar1 = ModulusSimpleCaseHelper<char,_unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::ModulusSimpleCase(local_10,local_2,&local_1);
  if (!bVar1) {
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)&stack0xffffffffffffffd8,&local_10);
    SafeInt::operator_cast_to_char(in_stack_ffffffffffffffe0);
    this = SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
           ::operator%((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(local_2.m_int,in_stack_ffffffffffffffe8),
                       (char)((ulong)in_stack_ffffffffffffffe0 >> 0x38));
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)this.m_int,
               (SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffffd8.m_int);
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}